

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_gethostbyname.c
# Opt level: O0

void sort6_addresses(hostent *host,apattern *sortlist,size_t nsort)

{
  undefined8 uVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  size_t ind2;
  size_t ind1;
  int i2;
  int i1;
  ares_in6_addr a2;
  ares_in6_addr a1;
  size_t nsort_local;
  apattern *sortlist_local;
  hostent *host_local;
  
  ind1._4_4_ = 0;
  do {
    if (host->h_addr_list[ind1._4_4_] == (char *)0x0) {
      return;
    }
    a2._S6_un._8_8_ = *(undefined8 *)host->h_addr_list[ind1._4_4_];
    uVar1 = *(undefined8 *)(host->h_addr_list[ind1._4_4_] + 8);
    sVar4 = get6_address_index((ares_in6_addr *)((long)&a2._S6_un + 8),sortlist,nsort);
    iVar3 = ind1._4_4_;
    while (ind1._0_4_ = iVar3 + -1, -1 < (int)ind1) {
      _i2 = *(undefined8 *)host->h_addr_list[(int)ind1];
      a2._S6_un._0_8_ = *(undefined8 *)(host->h_addr_list[(int)ind1] + 8);
      sVar5 = get6_address_index((ares_in6_addr *)&i2,sortlist,nsort);
      if (sVar5 <= sVar4) break;
      pcVar2 = host->h_addr_list[iVar3];
      *(undefined8 *)pcVar2 = _i2;
      *(undefined8 *)(pcVar2 + 8) = a2._S6_un._0_8_;
      iVar3 = (int)ind1;
    }
    pcVar2 = host->h_addr_list[iVar3];
    *(undefined8 *)pcVar2 = a2._S6_un._8_8_;
    *(undefined8 *)(pcVar2 + 8) = uVar1;
    ind1._4_4_ = ind1._4_4_ + 1;
  } while( true );
}

Assistant:

static void sort6_addresses(const struct hostent  *host,
                            const struct apattern *sortlist, size_t nsort)
{
  struct ares_in6_addr a1;
  struct ares_in6_addr a2;
  int                  i1;
  int                  i2;
  size_t               ind1;
  size_t               ind2;

  /* This is a simple insertion sort, not optimized at all.  i1 walks
   * through the address list, with the loop invariant that everything
   * to the left of i1 is sorted.  In the loop body, the value at i1 is moved
   * back through the list (via i2) until it is in sorted order.
   *
   * The IPv6s are sorted in ascending order of corresponding sortlist
   * indices, with those that don't match the subnets in the sortlist
   * coming last.  There is no particular order amongst IPs that tie
   * in this sorting scheme.
   */
  for (i1 = 0; host->h_addr_list[i1]; i1++) {
    memcpy(&a1, host->h_addr_list[i1], sizeof(struct ares_in6_addr));
    ind1 = get6_address_index(&a1, sortlist, nsort);
    for (i2 = i1 - 1; i2 >= 0; i2--) {
      memcpy(&a2, host->h_addr_list[i2], sizeof(struct ares_in6_addr));
      ind2 = get6_address_index(&a2, sortlist, nsort);
      if (ind2 <= ind1) {
        break;
      }
      memcpy(host->h_addr_list[i2 + 1], &a2, sizeof(struct ares_in6_addr));
    }
    memcpy(host->h_addr_list[i2 + 1], &a1, sizeof(struct ares_in6_addr));
  }
}